

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O1

Expression ** __thiscall
wasm::DataFlowOpts::getIndexPointer(DataFlowOpts *this,Expression *expr,Index index)

{
  Id IVar1;
  bool bVar2;
  
  IVar1 = expr->_id;
  if (IVar1 == SelectId) {
    if (index == 2) goto LAB_006c4dd3;
    if (index != 1) {
      if (index != 0) {
        handle_unreachable("unexpected index",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                           ,0xf9);
      }
      goto LAB_006c4dcd;
    }
    expr = expr + 1;
  }
  else {
    if (IVar1 == BinaryId) {
      if (index == 1) {
LAB_006c4dcd:
        expr = expr + 2;
        goto LAB_006c4dd7;
      }
      if (index != 0) {
        handle_unreachable("unexpected index",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                           ,0xf0);
      }
    }
    else {
      if (IVar1 != UnaryId) {
        bVar2 = true;
        goto LAB_006c4ddd;
      }
      if (index != 0) {
        __assert_fail("index == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                      ,0xe8,"Expression **wasm::DataFlowOpts::getIndexPointer(Expression *, Index)")
        ;
      }
    }
LAB_006c4dd3:
    expr = (Expression *)&expr[1].type;
  }
LAB_006c4dd7:
  bVar2 = false;
LAB_006c4ddd:
  if (!bVar2) {
    return (Expression **)expr;
  }
  handle_unreachable("unexpected expression type",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DataFlowOpts.cpp"
                     ,0xfb);
}

Assistant:

Expression** getIndexPointer(Expression* expr, Index index) {
    if (auto* unary = expr->dynCast<Unary>()) {
      assert(index == 0);
      return &unary->value;
    } else if (auto* binary = expr->dynCast<Binary>()) {
      if (index == 0) {
        return &binary->left;
      } else if (index == 1) {
        return &binary->right;
      }
      WASM_UNREACHABLE("unexpected index");
    } else if (auto* select = expr->dynCast<Select>()) {
      if (index == 0) {
        return &select->condition;
      } else if (index == 1) {
        return &select->ifTrue;
      } else if (index == 2) {
        return &select->ifFalse;
      }
      WASM_UNREACHABLE("unexpected index");
    }
    WASM_UNREACHABLE("unexpected expression type");
  }